

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_success_example.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  runtime_error *this;
  scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:33:5)>
  sVar2;
  scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:65:3)>
  NEARGYE_SCOPE_SUCCESS_2;
  fstream file;
  undefined1 local_276 [2];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:46:5),_scope_guard::detail::on_success_policy>
  local_274;
  int local_26c;
  type local_265;
  int NEARGYE_INTERNAL_OBJECT_1;
  scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:42:60)>
  scope_success_2;
  scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:38:5)>
  scope_success_1;
  undefined1 local_240 [8];
  scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:33:5)>
  NEARGYE_SCOPE_SUCCESS_0;
  char local_220 [8];
  fstream file_1;
  ostream local_210 [516];
  undefined4 local_c;
  
  local_c = 0;
  std::fstream::fstream(local_220);
  std::operator|(_S_out,_S_trunc);
  std::fstream::open(local_220,0x102004);
  scope_success_1 =
       (scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:38:5)>
        )local_220;
  sVar2 = scope_guard::detail::
          operator<<<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:33:5),_0>
                    (local_240,&scope_success_1);
  scope_guard::detail::
  operator<<<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:38:5),_0>
            (&scope_success_2.field_0x4,(undefined1 *)((long)&scope_success_2.policy_.ec_ + 2),
             sVar2.action_.file.file);
  scope_guard::detail::
  make_scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:42:60),_0>
            ((detail *)&NEARGYE_INTERNAL_OBJECT_1,&local_265);
  local_26c = 1;
  while (local_26c != 0) {
    local_26c = local_26c + -1;
    poVar1 = std::operator<<((ostream *)&std::cout,"[1] inside WITH_SCOPE_SUCCESS");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    scope_guard::detail::
    operator<<<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:46:5),_0>
              (&local_274,local_276);
    scope_guard::detail::
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/example/scope_success_example.cpp:46:5),_scope_guard::detail::on_success_policy>
    ::~scope_guard(&local_274);
  }
  local_26c = local_26c + -1;
  poVar1 = std::operator<<(local_210,"example");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"[1] write to file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::fstream::close();
  scope_guard::detail::
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/example/scope_success_example.cpp:38:5),_scope_guard::detail::on_success_policy>
  ::dismiss((scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:38:5),_scope_guard::detail::on_success_policy>
             *)&scope_success_2.field_0x4);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main() {
  try {
    std::fstream file;
    file.open("test.txt", std::fstream::out | std::fstream::trunc);
    SCOPE_SUCCESS{
      file.close();
      std::cout << "[1] file write success" << std::endl;
    };

    MAKE_SCOPE_SUCCESS(scope_success_1) {
      std::cout << "[1] file write success" << std::endl;
    };

    auto scope_success_2 = scope_guard::make_scope_success([&]() {
      std::cout << "[1] file write success" << std::endl;
    });

    WITH_SCOPE_SUCCESS({ std::cout << "[1] leave WITH_SCOPE_SUCCESS" << std::endl; }) {
      std::cout << "[1] inside WITH_SCOPE_SUCCESS" << std::endl;
    }

    file << "example" << std::endl;
    std::cout << "[1] write to file" << std::endl;
    file.close();

    scope_success_1.dismiss();

    throw std::runtime_error{"error"};

    scope_success_2.dismiss();
  }